

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O0

char * u_getTimeZoneFilesDirectory_63(UErrorCode *status)

{
  UBool UVar1;
  char *local_18;
  UErrorCode *status_local;
  
  icu_63::umtx_initOnce(&gTimeZoneFilesInitOnce_63,TimeZoneDataDirInitFn,status);
  UVar1 = U_SUCCESS(*status);
  if (UVar1 == '\0') {
    local_18 = "";
  }
  else {
    local_18 = icu_63::CharString::data(gTimeZoneFilesDirectory);
  }
  return local_18;
}

Assistant:

U_CAPI const char * U_EXPORT2
u_getTimeZoneFilesDirectory(UErrorCode *status) {
    umtx_initOnce(gTimeZoneFilesInitOnce, &TimeZoneDataDirInitFn, *status);
    return U_SUCCESS(*status) ? gTimeZoneFilesDirectory->data() : "";
}